

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::stmt_peek_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  indent_abi_cxx11_(&local_50,(re2c *)(ulong)ind,ind);
  expr_peek_save_abi_cxx11_(&local_70,this);
  std::operator+(&local_30,&local_50,&local_70);
  std::operator+(__return_storage_ptr__,&local_30,";\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_peek (uint32_t ind) const
{
	return indent (ind) + expr_peek_save () + ";\n";
}